

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_print.c
# Opt level: O1

void srunner_fprint(FILE *file,SRunner *sr,print_output print_mode)

{
  List *lp;
  int iVar1;
  char *__ptr;
  TestResult *tr;
  
  if (print_mode == CK_ENV) {
    print_mode = get_env_printmode();
  }
  if (print_mode != CK_SILENT) {
    __ptr = sr_stat_str(sr);
    fprintf((FILE *)file,"%s\n",__ptr);
    free(__ptr);
  }
  lp = sr->resultlst;
  check_list_front(lp);
  while( true ) {
    iVar1 = check_list_at_end(lp);
    if (iVar1 != 0) break;
    tr = (TestResult *)check_list_val(lp);
    tr_fprint(file,tr,print_mode);
    check_list_advance(lp);
  }
  return;
}

Assistant:

void srunner_fprint(FILE * file, SRunner * sr, enum print_output print_mode)
{
    if(print_mode == CK_ENV)
    {
        print_mode = get_env_printmode();
    }

    srunner_fprint_summary(file, sr, print_mode);
    srunner_fprint_results(file, sr, print_mode);
}